

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
slang::SmallVectorBase<slang::ConstantRange>::emplace_back<slang::ConstantRange>
          (SmallVectorBase<slang::ConstantRange> *this,ConstantRange *args)

{
  ulong uVar1;
  ConstantRange *p;
  ConstantRange *pCVar2;
  ConstantRange *pCVar3;
  ConstantRange *pCVar4;
  long lVar5;
  long lVar6;
  ConstantRange *__src;
  size_type sVar7;
  ulong uVar8;
  
  __src = this->data_ + this->len;
  if (this->len != this->cap) {
    *__src = *args;
    sVar7 = this->len;
    this->len = sVar7 + 1;
    return this->data_ + sVar7;
  }
  if (this->len == 0xfffffffffffffff) {
    detail::throwLengthError();
  }
  uVar8 = this->len + 1;
  uVar1 = this->cap;
  if (uVar8 < uVar1 * 2) {
    uVar8 = uVar1 * 2;
  }
  if (0xfffffffffffffff - uVar1 < uVar1) {
    uVar8 = 0xfffffffffffffff;
  }
  lVar6 = (long)__src - (long)this->data_;
  pCVar2 = (ConstantRange *)operator_new(uVar8 * 8);
  *(ConstantRange *)((long)pCVar2 + lVar6) = *args;
  p = this->data_;
  sVar7 = this->len;
  lVar5 = (long)p + (sVar7 * 8 - (long)__src);
  pCVar3 = p;
  pCVar4 = pCVar2;
  if (lVar5 == 0) {
    pCVar3 = pCVar2;
    pCVar4 = p;
    if (sVar7 != 0) {
      do {
        *pCVar3 = *pCVar4;
        pCVar4 = pCVar4 + 1;
        pCVar3 = pCVar3 + 1;
      } while (pCVar4 != __src);
    }
  }
  else {
    for (; pCVar3 != __src; pCVar3 = pCVar3 + 1) {
      *pCVar4 = *pCVar3;
      pCVar4 = pCVar4 + 1;
    }
    memcpy((void *)((long)pCVar2 + lVar6 + 8),__src,(lVar5 - 8U & 0xfffffffffffffff8) + 8);
  }
  if (p != (ConstantRange *)this->firstElement) {
    operator_delete(p);
    sVar7 = this->len;
  }
  this->len = sVar7 + 1;
  this->cap = uVar8;
  this->data_ = pCVar2;
  return (reference)((long)pCVar2 + lVar6);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }